

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void google::protobuf::
     SplitStringToIteratorAllowEmpty<std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
               (StringPiece full,char *delim,int pieces,
               back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *result)

{
  bool bVar1;
  int in_ECX;
  StringPiece *in_RSI;
  size_type in_RDI;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_R8;
  StringPiece in_stack_00000000;
  int i;
  size_type end_index;
  size_type begin_index;
  value_type *in_stack_fffffffffffffed8;
  value_type *__value;
  StringPiece *in_stack_fffffffffffffee0;
  size_type in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 uVar2;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  StringPiece local_100;
  value_type local_f0;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  StringPiece local_c8;
  StringPiece local_b8 [3];
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  StringPiece local_80;
  string local_70 [52];
  int local_3c;
  stringpiece_ssize_type local_38;
  long local_30;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_28;
  int local_1c;
  
  local_30 = 0;
  local_3c = 0;
  local_28 = in_R8;
  local_1c = in_ECX;
  while( true ) {
    bVar1 = local_3c < local_1c + -1;
    uVar2 = bVar1 || local_1c == 0;
    if (!bVar1 && local_1c != 0) {
      local_100 = StringPiece::substr((StringPiece *)CONCAT17(uVar2,in_stack_fffffffffffffef0),
                                      in_stack_fffffffffffffee8,(size_type)in_stack_fffffffffffffee0
                                     );
      __value = &local_f0;
      StringPiece::operator_cast_to_string((StringPiece *)__value);
      local_108 = std::
                  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(local_28,0);
      std::
      back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_108);
      std::
      back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator=((back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffee0,__value);
      std::__cxx11::string::~string((string *)&local_f0);
      return;
    }
    StringPiece::StringPiece(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
    local_38 = StringPiece::find_first_of(in_RSI,in_stack_00000000,in_RDI);
    if (local_38 == -1) break;
    local_c8 = StringPiece::substr((StringPiece *)CONCAT17(uVar2,in_stack_fffffffffffffef0),
                                   in_stack_fffffffffffffee8,(size_type)in_stack_fffffffffffffee0);
    in_stack_fffffffffffffee0 = local_b8;
    StringPiece::operator_cast_to_string((StringPiece *)in_stack_fffffffffffffed8);
    local_d0 = std::
               back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator++(local_28,0);
    std::
    back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&local_d0);
    std::
    back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=((back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::__cxx11::string::~string((string *)local_b8);
    local_30 = local_38 + 1;
    local_3c = local_3c + 1;
  }
  local_80 = StringPiece::substr((StringPiece *)CONCAT17(uVar2,in_stack_fffffffffffffef0),
                                 in_stack_fffffffffffffee8,(size_type)in_stack_fffffffffffffee0);
  StringPiece::operator_cast_to_string((StringPiece *)in_stack_fffffffffffffed8);
  local_88 = std::
             back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator++(local_28,0);
  std::
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator*(&local_88);
  std::
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

static inline void SplitStringToIteratorAllowEmpty(StringPiece full,
                                                   const char *delim,
                                                   int pieces, ITR &result) {
  std::string::size_type begin_index, end_index;
  begin_index = 0;

  for (int i = 0; (i < pieces-1) || (pieces == 0); i++) {
    end_index = full.find_first_of(delim, begin_index);
    if (end_index == std::string::npos) {
      *result++ = std::string(full.substr(begin_index));
      return;
    }
    *result++ =
        std::string(full.substr(begin_index, (end_index - begin_index)));
    begin_index = end_index + 1;
  }
  *result++ = std::string(full.substr(begin_index));
}